

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  char cVar1;
  IMutableContext *pIVar2;
  ulong uVar3;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&s,(string *)value);
  pIVar2 = getCurrentMutableContext();
  (*(pIVar2->super_IContext)._vptr_IContext[6])(&subs,pIVar2);
  cVar1 = (**(code **)(*(long *)subs._M_dataplus._M_p + 0x58))();
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)&subs);
  if (cVar1 != '\0') {
    for (uVar3 = 0; uVar3 < s._M_string_length; uVar3 = uVar3 + 1) {
      subs._M_dataplus._M_p = (pointer)&subs.field_2;
      subs._M_string_length = 0;
      subs.field_2._M_local_buf[0] = '\0';
      if (((s._M_dataplus._M_p[uVar3] == '\t') || (s._M_dataplus._M_p[uVar3] == '\n')) &&
         (std::__cxx11::string::assign((char *)&subs), subs._M_string_length != 0)) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&s);
        std::operator+(&local_70,&local_b0,&subs);
        uVar3 = uVar3 + 1;
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&s);
        std::operator+(&local_50,&local_70,&local_90);
        std::__cxx11::string::operator=((string *)&s,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&subs);
    }
  }
  std::operator+(&subs,"\"",&s);
  std::operator+(__return_storage_ptr__,&subs,"\"");
  std::__cxx11::string::~string((string *)&subs);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}